

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# servls.cpp
# Opt level: O3

void __thiscall
icu_63::ServiceEnumeration::ServiceEnumeration
          (ServiceEnumeration *this,ServiceEnumeration *other,UErrorCode *status)

{
  int iVar1;
  long *plVar2;
  void *obj;
  int index;
  
  StringEnumeration::StringEnumeration(&this->super_StringEnumeration);
  (this->super_StringEnumeration).super_UObject._vptr_UObject =
       (_func_int **)&PTR__ServiceEnumeration_003b82c0;
  this->_service = other->_service;
  this->_timestamp = other->_timestamp;
  UVector::UVector(&this->_ids,uprv_deleteUObject_63,(UElementsAreEqual *)0x0,status);
  this->_pos = 0;
  if (*status < U_ILLEGAL_ARGUMENT_ERROR) {
    iVar1 = (other->_ids).count;
    if (0 < iVar1) {
      index = 0;
      do {
        plVar2 = (long *)UVector::elementAt(&other->_ids,index);
        obj = (void *)(**(code **)(*plVar2 + 0x38))(plVar2);
        UVector::addElement(&this->_ids,obj,status);
        index = index + 1;
      } while (iVar1 != index);
      if (U_ZERO_ERROR < *status) {
        return;
      }
    }
    this->_pos = other->_pos;
  }
  return;
}

Assistant:

ServiceEnumeration(const ServiceEnumeration &other, UErrorCode &status)
        : _service(other._service)
        , _timestamp(other._timestamp)
        , _ids(uprv_deleteUObject, NULL, status)
        , _pos(0)
    {
        if(U_SUCCESS(status)) {
            int32_t i, length;

            length = other._ids.size();
            for(i = 0; i < length; ++i) {
                _ids.addElement(((UnicodeString *)other._ids.elementAt(i))->clone(), status);
            }

            if(U_SUCCESS(status)) {
                _pos = other._pos;
            }
        }
    }